

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O0

LispPTR LCFetchMethod(LispPTR class,LispPTR selector)

{
  LispPTR LVar1;
  int iVar2;
  LCMethodCacheEntry *pLVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  LispPTR *selectorptr;
  LCClass *classptr;
  LispPTR val;
  int i;
  LispPTR supers;
  LispPTR cur_class;
  LCMethodCacheEntry *ce;
  LispPTR selector_local;
  LispPTR class_local;
  
  if (atom_instance == 0) {
    LCinit();
  }
  pLVar3 = LCMethodCache + ((class ^ selector) & 0x3ff);
  if ((pLVar3->class == class) && (pLVar3->selector == selector)) {
    selector_local = pLVar3->method_fn;
  }
  else if ((*(uint *)(DTDspace +
                     (long)(int)((*(ushort *)((ulong)(MDStypetbl + (class >> 9)) ^ 2) & 0x7ff) << 4)
                     + (long)(int)((*(ushort *)((ulong)(MDStypetbl + (class >> 9)) ^ 2) & 0x7ff) <<
                                  1)) & 0xfffffff) == atom_class) {
    pLVar4 = NativeAligned4FromLAddr(class);
    val = pLVar4[8];
    i = class;
    while( true ) {
      classptr._4_4_ = 0;
      pLVar4 = NativeAligned4FromLAddr(i);
      if (pLVar4[0xb] != 0) {
        pLVar5 = NativeAligned4FromLAddr(pLVar4[0xb]);
        iVar2 = classptr._4_4_;
        while( true ) {
          classptr._4_4_ = iVar2;
          if (pLVar5[classptr._4_4_] == 0) break;
          iVar2 = classptr._4_4_ + 1;
          if (pLVar5[classptr._4_4_] == selector) {
            pLVar3->class = class;
            pLVar3->selector = selector;
            pLVar4 = NativeAligned4FromLAddr(pLVar4[0xc]);
            LVar1 = pLVar4[classptr._4_4_];
            pLVar3->method_fn = LVar1;
            return LVar1;
          }
        }
      }
      i = car(val);
      if (i == 0) break;
      val = cdr(val);
    }
    selector_local = 0;
  }
  else {
    selector_local = lcfuncall(atom_FetchMethod_LCUFN,2,3);
  }
  return selector_local;
}

Assistant:

LispPTR LCFetchMethod(LispPTR class, LispPTR selector) {
  struct LCMethodCacheEntry *ce;

  LC_INIT;

  /* Check cache before doing type check */
  ce = &(LCMethodCache[METH_CACHE_INDEX(class, selector)]);
  if (ce->class == class && ce->selector == selector) return ce->method_fn;

  /* it wasn't there, go search class then supers */

  if (!LC_TYPEP(class, atom_class)) RETCALL(atom_FetchMethod_LCUFN, 2);
  {
    LispPTR cur_class = class;
    LispPTR supers = ((struct LCClass *)NativeAligned4FromLAddr(cur_class))->supers;

    for (;;) {
      int i = 0;
      LispPTR val;
      struct LCClass *classptr;
      LispPTR *selectorptr;

      classptr = (struct LCClass *)NativeAligned4FromLAddr(cur_class);
      if (classptr->selectors == NIL_PTR)
        goto next_class;
      else
        selectorptr = (LispPTR *)NativeAligned4FromLAddr(classptr->selectors);

      while ((val = selectorptr[i++]) != NIL_PTR) {
        if (val == selector) {
          ce->class = class;
          ce->selector = selector;
          return (ce->method_fn = ((LispPTR *)NativeAligned4FromLAddr(classptr->methods))[i - 1]);
        }
      }

    next_class:
      if ((cur_class = car(supers)) == NIL_PTR) break;
      supers = cdr(supers);
    }
  }

  /* we didn't find it at all; return NIL */
  return NIL_PTR;
}